

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_PNG_Image.cxx
# Opt level: O1

void __thiscall
Fl_PNG_Image::load_png_(Fl_PNG_Image *this,char *name_png,uchar *buffer_png,int maxsize)

{
  int iVar1;
  char cVar2;
  byte bVar3;
  byte bVar4;
  int iVar5;
  FILE *__stream;
  __jmp_buf_tag *p_Var6;
  uchar *puVar7;
  void *pvVar8;
  Fl_Shared_Image *this_00;
  ulong uVar9;
  long lVar10;
  char *pcVar11;
  long lVar12;
  char *pcVar13;
  int iVar14;
  bool bVar15;
  png_structp pp;
  png_infop info;
  int num_trans;
  fl_png_memory png_mem_data;
  long local_78;
  long local_70;
  FILE *local_68;
  char *local_60;
  uchar *local_58;
  int local_4c;
  long local_48;
  uchar *local_40;
  uchar *local_38;
  
  local_70 = 0;
  if (buffer_png == (uchar *)0x0) {
    __stream = (FILE *)fl_fopen(name_png,"rb");
    if (__stream == (FILE *)0x0) {
      (this->super_Fl_RGB_Image).super_Fl_Image.ld_ = -2;
      return;
    }
  }
  else {
    __stream = (FILE *)0x0;
  }
  pcVar13 = "In-memory PNG data";
  if (name_png != (char *)0x0) {
    pcVar13 = name_png;
  }
  local_78 = png_create_read_struct("1.6.37",0,0);
  if (local_78 != 0) {
    local_70 = png_create_info_struct(local_78);
  }
  if ((local_78 == 0) || (local_70 == 0)) {
    if (local_78 != 0) {
      png_destroy_read_struct(&local_78,0);
    }
    if (buffer_png == (uchar *)0x0) {
      fclose(__stream);
    }
    pcVar11 = "Cannot allocate memory to read PNG file or data \"%s\".\n";
  }
  else {
    p_Var6 = (__jmp_buf_tag *)png_set_longjmp_fn(local_78,longjmp,200);
    iVar5 = _setjmp(p_Var6);
    if (iVar5 == 0) {
      if (buffer_png == (uchar *)0x0) {
        png_init_io(local_78,__stream);
      }
      else {
        local_38 = buffer_png + maxsize;
        local_48 = local_78;
        local_40 = buffer_png;
        png_set_read_fn(local_78,&local_48,png_read_data_from_mem);
      }
      png_read_info(local_78,local_70);
      cVar2 = png_get_color_type(local_78,local_70);
      if (cVar2 == '\x03') {
        png_set_expand(local_78);
      }
      bVar3 = png_get_color_type(local_78,local_70);
      local_4c = 0;
      png_get_tRNS(local_78,local_70,0,&local_4c,0);
      bVar4 = png_get_color_type(local_78,local_70);
      bVar15 = local_4c != 0;
      iVar5 = png_get_image_width(local_78,local_70);
      (this->super_Fl_RGB_Image).super_Fl_Image.w_ = iVar5;
      iVar5 = png_get_image_height(local_78,local_70);
      (this->super_Fl_RGB_Image).super_Fl_Image.h_ = iVar5;
      (this->super_Fl_RGB_Image).super_Fl_Image.d_ =
           (byte)(bVar15 | (bVar4 & 4) >> 2 | bVar3 & 2) + 1;
      bVar3 = png_get_bit_depth(local_78,local_70);
      if (bVar3 < 8) {
        png_set_packing();
        png_set_expand(local_78);
      }
      else {
        cVar2 = png_get_bit_depth(local_78,local_70);
        if (cVar2 == '\x10') {
          png_set_strip_16(local_78);
        }
      }
      local_68 = __stream;
      iVar5 = png_get_valid(local_78,local_70,0x10);
      if (iVar5 != 0) {
        png_set_tRNS_to_alpha(local_78);
      }
      iVar5 = (this->super_Fl_RGB_Image).super_Fl_Image.w_;
      iVar1 = (this->super_Fl_RGB_Image).super_Fl_Image.h_;
      lVar12 = (long)iVar1;
      iVar14 = (this->super_Fl_RGB_Image).super_Fl_Image.d_;
      uVar9 = lVar12 * iVar5 * (long)iVar14;
      local_60 = name_png;
      local_58 = buffer_png;
      if (Fl_RGB_Image::max_size_ <= uVar9 && uVar9 - Fl_RGB_Image::max_size_ != 0) {
        p_Var6 = (__jmp_buf_tag *)png_set_longjmp_fn(local_78,longjmp,200);
        longjmp(p_Var6,1);
      }
      iVar14 = iVar14 * iVar5;
      puVar7 = (uchar *)operator_new__((long)(iVar14 * iVar1));
      (this->super_Fl_RGB_Image).array = puVar7;
      (this->super_Fl_RGB_Image).alloc_array = 1;
      uVar9 = 0xffffffffffffffff;
      if (-1 < iVar1) {
        uVar9 = lVar12 * 8;
      }
      pvVar8 = operator_new__(uVar9);
      if (0 < iVar1) {
        iVar5 = 0;
        lVar10 = 0;
        do {
          *(uchar **)((long)pvVar8 + lVar10 * 8) = puVar7 + iVar5;
          lVar10 = lVar10 + 1;
          iVar5 = iVar5 + iVar14;
        } while (lVar12 != lVar10);
      }
      iVar5 = png_set_interlace_handling(local_78);
      if (0 < iVar5) {
        iVar5 = iVar5 + 1;
        do {
          png_read_rows(local_78,pvVar8,0,(this->super_Fl_RGB_Image).super_Fl_Image.h_);
          iVar5 = iVar5 + -1;
        } while (1 < iVar5);
      }
      operator_delete__(pvVar8);
      png_read_end(local_78,local_70);
      png_destroy_read_struct(&local_78,&local_70,0);
      pcVar13 = local_60;
      if (local_58 != (uchar *)0x0) {
        if ((this->super_Fl_RGB_Image).super_Fl_Image.w_ == 0) {
          return;
        }
        if (local_60 == (char *)0x0) {
          return;
        }
        if ((this->super_Fl_RGB_Image).super_Fl_Image.h_ == 0) {
          return;
        }
        this_00 = (Fl_Shared_Image *)operator_new(0x48);
        Fl_Shared_Image::Fl_Shared_Image(this_00,pcVar13,(Fl_Image *)this);
        Fl_Shared_Image::add(this_00);
        return;
      }
      fclose(local_68);
      return;
    }
    png_destroy_read_struct(&local_78,&local_70,0);
    if (buffer_png == (uchar *)0x0) {
      fclose(__stream);
    }
    pcVar11 = "PNG file or data \"%s\" is too large or contains errors!\n";
  }
  (*Fl::warning)(pcVar11,pcVar13);
  (this->super_Fl_RGB_Image).super_Fl_Image.w_ = 0;
  (this->super_Fl_RGB_Image).super_Fl_Image.h_ = 0;
  (this->super_Fl_RGB_Image).super_Fl_Image.d_ = 0;
  (this->super_Fl_RGB_Image).super_Fl_Image.ld_ = -3;
  return;
}

Assistant:

void Fl_PNG_Image::load_png_(const char *name_png, const unsigned char *buffer_png, int maxsize)
{
#if defined(HAVE_LIBPNG) && defined(HAVE_LIBZ)
  int i;	  // Looping var
  FILE *fp = NULL;	  // File pointer
  int channels;	  // Number of color channels
  png_structp pp; // PNG read pointer
  png_infop info = 0; // PNG info pointers
  png_bytep *rows;// PNG row pointers
  fl_png_memory png_mem_data;
  int from_memory = (buffer_png != NULL); // true if reading image from memory

  if (!from_memory) {
    if ((fp = fl_fopen(name_png, "rb")) == NULL) {
      ld(ERR_FILE_ACCESS);
      return;
    }
  }
  const char *display_name = (name_png ? name_png : "In-memory PNG data");

  // Setup the PNG data structures...
  pp = png_create_read_struct(PNG_LIBPNG_VER_STRING, NULL, NULL, NULL);
  if (pp) info = png_create_info_struct(pp);
  if (!pp || !info) {
    if (pp) png_destroy_read_struct(&pp, NULL, NULL);
    if (!from_memory) fclose(fp);
    Fl::warning("Cannot allocate memory to read PNG file or data \"%s\".\n", display_name);
    w(0); h(0); d(0); ld(ERR_FORMAT);
    return;
  }
  
  if (setjmp(png_jmpbuf(pp)))
  {
    png_destroy_read_struct(&pp, &info, NULL);
    if (!from_memory) fclose(fp);
    Fl::warning("PNG file or data \"%s\" is too large or contains errors!\n", display_name);
    w(0); h(0); d(0); ld(ERR_FORMAT);
    return;
  }

  if (from_memory) {
    png_mem_data.current = buffer_png;
    png_mem_data.last = buffer_png + maxsize;
    png_mem_data.pp = pp;
    // Initialize the function pointer to the PNG read "engine"...
    png_set_read_fn (pp, (png_voidp) &png_mem_data, png_read_data_from_mem);
  } else {
    png_init_io(pp, fp); // Initialize the PNG file read "engine"...
  }  

  // Get the image dimensions and convert to grayscale or RGB...
  png_read_info(pp, info);

  if (png_get_color_type(pp, info) == PNG_COLOR_TYPE_PALETTE)
    png_set_expand(pp);

  if (png_get_color_type(pp, info) & PNG_COLOR_MASK_COLOR)
    channels = 3;
  else
    channels = 1;

  int num_trans = 0;
  png_get_tRNS(pp, info, 0, &num_trans, 0);
  if ((png_get_color_type(pp, info) & PNG_COLOR_MASK_ALPHA) || (num_trans != 0))
    channels ++;

  w((int)(png_get_image_width(pp, info)));
  h((int)(png_get_image_height(pp, info)));
  d(channels);

  if (png_get_bit_depth(pp, info) < 8)
  {
    png_set_packing(pp);
    png_set_expand(pp);
  }
  else if (png_get_bit_depth(pp, info) == 16)
    png_set_strip_16(pp);

#  if defined(HAVE_PNG_GET_VALID) && defined(HAVE_PNG_SET_TRNS_TO_ALPHA)
  // Handle transparency...
  if (png_get_valid(pp, info, PNG_INFO_tRNS))
    png_set_tRNS_to_alpha(pp);
#  endif // HAVE_PNG_GET_VALID && HAVE_PNG_SET_TRNS_TO_ALPHA

  if (((size_t)w()) * h() * d() > max_size() ) longjmp(png_jmpbuf(pp), 1);
  array = new uchar[w() * h() * d()];
  alloc_array = 1;

  // Allocate pointers...
  rows = new png_bytep[h()];

  for (i = 0; i < h(); i ++)
    rows[i] = (png_bytep)(array + i * w() * d());

  // Read the image, handling interlacing as needed...
  for (i = png_set_interlace_handling(pp); i > 0; i --)
    png_read_rows(pp, rows, NULL, h());

#ifdef WIN32
  // Some Windows graphics drivers don't honor transparency when RGB == white
  if (channels == 4) {
    // Convert RGB to 0 when alpha == 0...
    uchar *ptr = (uchar *)array;
    for (i = w() * h(); i > 0; i --, ptr += 4)
      if (!ptr[3]) ptr[0] = ptr[1] = ptr[2] = 0;
  }
#endif // WIN32

  // Free memory and return...
  delete[] rows;

  png_read_end(pp, info);
  png_destroy_read_struct(&pp, &info, NULL);

  if (from_memory) {
    if (w() && h() && name_png) {
      Fl_Shared_Image *si = new Fl_Shared_Image(name_png, this);
      si->add();
    }
  } else {
    fclose(fp);
  }
#endif // HAVE_LIBPNG && HAVE_LIBZ
}